

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O1

void Sbm_AddCardinConstrMerge(sat_solver *p,int *pVars,int lo,int hi,int r,int *pnVars)

{
  int iVar1;
  int hi_00;
  int iVar2;
  int i;
  int k;
  long lVar3;
  lit Lits [2];
  int local_40;
  int local_3c;
  ulong local_38;
  
  iVar1 = r * 2;
  if (iVar1 < hi - lo) {
    hi_00 = hi - r;
    Sbm_AddCardinConstrMerge(p,pVars,lo,hi_00,iVar1,pnVars);
    iVar2 = r + lo;
    local_38 = (ulong)(uint)r;
    Sbm_AddCardinConstrMerge(p,pVars,iVar2,hi,iVar1,pnVars);
    if (iVar2 < hi_00) {
      k = lo + iVar1;
      i = iVar2;
      do {
        Sbm_AddSorter(p,pVars,i,k,pnVars);
        i = i + iVar1;
        k = k + iVar1;
      } while (i < hi_00);
    }
    if (iVar2 < hi_00 + -1) {
      lVar3 = (long)iVar2;
      iVar1 = (int)local_38;
      do {
        if (pVars[lVar3] < 0) {
LAB_007a9805:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        local_40 = pVars[lVar3] * 2;
        if (pVars[iVar1 + lVar3] < 0) goto LAB_007a9805;
        local_3c = pVars[iVar1 + lVar3] * 2 + 1;
        iVar2 = sat_solver_addclause(p,&local_40,(lit *)&local_38);
        if (iVar2 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                        ,0x141,
                        "void Sbm_AddCardinConstrMerge(sat_solver *, int *, int, int, int, int *)");
        }
        lVar3 = lVar3 + iVar1;
      } while (lVar3 < hi_00 + -1);
    }
  }
  return;
}

Assistant:

static inline void Sbm_AddCardinConstrMerge( sat_solver * p, int * pVars, int lo, int hi, int r, int * pnVars )
{
    int i, step = r * 2;
    if ( step < hi - lo )
    {
        Sbm_AddCardinConstrMerge( p, pVars, lo, hi-r, step, pnVars );
        Sbm_AddCardinConstrMerge( p, pVars, lo+r, hi, step, pnVars );
        for ( i = lo+r; i < hi-r; i += step )
            Sbm_AddSorter( p, pVars, i, i+r, pnVars );
        for ( i = lo+r; i < hi-r-1; i += r )
        {
            lit Lits[2] = { Abc_Var2Lit(pVars[i], 0), Abc_Var2Lit(pVars[i+r], 1) };
            int Cid = sat_solver_addclause( p, Lits, Lits + 2 );
            assert( Cid );
        }
    }
}